

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O1

void __thiscall QCss::StyleSheet::buildIndexes(StyleSheet *this,CaseSensitivity nameCaseSensitivity)

{
  long lVar1;
  StyleRule *pSVar2;
  long lVar3;
  long lVar4;
  size_t sVar5;
  Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_> *pDVar6;
  Chain **ppCVar7;
  Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_> *pDVar8;
  int iVar9;
  Selector *pSVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  long in_FS_OFFSET;
  StyleRule nr;
  iterator local_f8;
  iterator local_d8;
  QArrayDataPointer<QCss::Selector> local_b8;
  QArrayDataPointer<QCss::StyleRule> local_98;
  StyleRule local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_98.d = (Data *)0x0;
  local_98.ptr = (StyleRule *)0x0;
  local_98.size = 0;
  if ((this->styleRules).d.size != 0) {
    uVar11 = 0;
    do {
      pSVar2 = (this->styleRules).d.ptr;
      local_b8.d = (Data *)0x0;
      local_b8.ptr = (Selector *)0x0;
      local_b8.size = 0;
      iVar9 = (int)uVar11;
      if (pSVar2[uVar11].selectors.d.size != 0) {
        lVar12 = 0;
        uVar13 = 0;
        do {
          pSVar10 = pSVar2[uVar11].selectors.d.ptr;
          lVar3 = *(long *)((long)&(pSVar10->basicSelectors).d.size + lVar12);
          if ((lVar3 != 0) &&
             (lVar4 = *(long *)((long)&(pSVar10->basicSelectors).d.ptr + lVar12),
             (lVar3 == 1) == (*(int *)(lVar4 + 0x60) == 0))) {
            pSVar10 = (Selector *)((long)&(pSVar10->basicSelectors).d.d + lVar12);
            lVar1 = lVar4 + lVar3 * 0x68;
            if (*(long *)(lVar4 + -0x40 + lVar3 * 0x68) == 0) {
              if (*(long *)(lVar1 + -0x58) == 0) {
                QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
                          ((QMovableArrayOps<QCss::Selector> *)&local_b8,local_b8.size,pSVar10);
                QList<QCss::Selector>::end((QList<QCss::Selector> *)&local_b8);
                goto LAB_005ecd44;
              }
              local_78.selectors.d.size = 0;
              local_78.declarations.d.d = (Data *)0x0;
              local_78.selectors.d.d = (Data *)0x0;
              local_78.selectors.d.ptr = (Selector *)0x0;
              local_78.declarations.d.ptr = (Declaration *)0x0;
              local_78.declarations.d.size = 0;
              local_78.order = 0;
              local_78._52_4_ = 0xaaaaaaaa;
              QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
                        ((QMovableArrayOps<QCss::Selector> *)&local_78,0,pSVar10);
              QList<QCss::Selector>::end(&local_78.selectors);
              QArrayDataPointer<QCss::Declaration>::operator=
                        (&local_78.declarations.d,&pSVar2[uVar11].declarations.d);
              local_78.order = iVar9;
              local_d8.i.d = *(Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_> **)
                              (lVar1 + -0x68);
              local_d8.i.bucket = *(size_t *)(lVar1 + -0x60);
              local_d8.e = *(Chain ***)(lVar1 + -0x58);
              if (local_d8.i.d != (Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_> *)0x0) {
                LOCK();
                ((local_d8.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
                     ((local_d8.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
                UNLOCK();
              }
              if (nameCaseSensitivity == CaseInsensitive) {
                QString::toLower_helper((QString *)&local_f8);
                sVar5 = local_d8.i.bucket;
                pDVar8 = local_d8.i.d;
                ppCVar7 = local_f8.e;
                pDVar6 = local_f8.i.d;
                local_f8.i.d = local_d8.i.d;
                local_f8.e = local_d8.e;
                local_d8.i.d = pDVar6;
                local_d8.i.bucket = local_f8.i.bucket;
                local_f8.i.bucket = sVar5;
                local_d8.e = ppCVar7;
                if (pDVar8 != (Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_> *)0x0) {
                  LOCK();
                  (pDVar8->ref).atomic._q_value.super___atomic_base<int>._M_i =
                       (pDVar8->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((pDVar8->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate((QArrayData *)pDVar8,2,0x10);
                  }
                }
              }
              QMultiHash<QString,QCss::StyleRule>::emplace<QCss::StyleRule_const&>
                        (&local_f8,&this->nameIndex,(QString *)&local_d8,&local_78);
              if (local_d8.i.d != (Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_> *)0x0) {
                LOCK();
                ((local_d8.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
                     ((local_d8.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_d8.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate((QArrayData *)local_d8.i.d,2,0x10);
                }
              }
              QArrayDataPointer<QCss::Declaration>::~QArrayDataPointer(&local_78.declarations.d);
            }
            else {
              local_78.selectors.d.size = 0;
              local_78.declarations.d.d = (Data *)0x0;
              local_78.selectors.d.d = (Data *)0x0;
              local_78.selectors.d.ptr = (Selector *)0x0;
              local_78.declarations.d.ptr = (Declaration *)0x0;
              local_78.declarations.d.size = 0;
              local_78.order = 0;
              local_78._52_4_ = 0xaaaaaaaa;
              QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
                        ((QMovableArrayOps<QCss::Selector> *)&local_78,0,pSVar10);
              QList<QCss::Selector>::end(&local_78.selectors);
              QArrayDataPointer<QCss::Declaration>::operator=
                        (&local_78.declarations.d,&pSVar2[uVar11].declarations.d);
              local_78.order = iVar9;
              QMultiHash<QString,QCss::StyleRule>::emplace<QCss::StyleRule_const&>
                        (&local_d8,&this->idIndex,*(QString **)(lVar1 + -0x48),&local_78);
              QArrayDataPointer<QCss::Declaration>::~QArrayDataPointer(&local_78.declarations.d);
            }
            QArrayDataPointer<QCss::Selector>::~QArrayDataPointer
                      ((QArrayDataPointer<QCss::Selector> *)&local_78);
          }
LAB_005ecd44:
          uVar13 = uVar13 + 1;
          lVar12 = lVar12 + 0x18;
        } while (uVar13 < (ulong)pSVar2[uVar11].selectors.d.size);
      }
      if (local_b8.size != 0) {
        local_78.selectors.d.d = (Data *)0x0;
        local_78.selectors.d.ptr = (Selector *)0x0;
        local_78.selectors.d.size = 0;
        local_78.declarations.d.d = (Data *)0x0;
        local_78.declarations.d.ptr = (Declaration *)0x0;
        local_78.declarations.d.size = 0;
        local_78.order = 0;
        local_78._52_4_ = 0xaaaaaaaa;
        QArrayDataPointer<QCss::Selector>::operator=
                  ((QArrayDataPointer<QCss::Selector> *)&local_78,&local_b8);
        QArrayDataPointer<QCss::Declaration>::operator=
                  (&local_78.declarations.d,&pSVar2[uVar11].declarations.d);
        local_78.order = iVar9;
        QtPrivate::QMovableArrayOps<QCss::StyleRule>::emplace<QCss::StyleRule_const&>
                  ((QMovableArrayOps<QCss::StyleRule> *)&local_98,local_98.size,&local_78);
        QList<QCss::StyleRule>::end((QList<QCss::StyleRule> *)&local_98);
        QArrayDataPointer<QCss::Declaration>::~QArrayDataPointer(&local_78.declarations.d);
        QArrayDataPointer<QCss::Selector>::~QArrayDataPointer
                  ((QArrayDataPointer<QCss::Selector> *)&local_78);
      }
      QArrayDataPointer<QCss::Selector>::~QArrayDataPointer(&local_b8);
      uVar11 = uVar11 + 1;
    } while (uVar11 < (ulong)(this->styleRules).d.size);
  }
  QArrayDataPointer<QCss::StyleRule>::operator=
            ((QArrayDataPointer<QCss::StyleRule> *)this,&local_98);
  QArrayDataPointer<QCss::StyleRule>::~QArrayDataPointer(&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void StyleSheet::buildIndexes(Qt::CaseSensitivity nameCaseSensitivity)
{
    QList<StyleRule> universals;
    for (int i = 0; i < styleRules.size(); ++i) {
        const StyleRule &rule = styleRules.at(i);
        QList<Selector> universalsSelectors;
        for (int j = 0; j < rule.selectors.size(); ++j) {
            const Selector& selector = rule.selectors.at(j);

            if (selector.basicSelectors.isEmpty())
                continue;

            if (selector.basicSelectors.at(0).relationToNext == BasicSelector::NoRelation) {
                if (selector.basicSelectors.size() != 1)
                    continue;
            } else if (selector.basicSelectors.size() <= 1) {
                continue;
            }

            const BasicSelector &sel = selector.basicSelectors.at(selector.basicSelectors.size() - 1);

            if (!sel.ids.isEmpty()) {
                StyleRule nr;
                nr.selectors += selector;
                nr.declarations = rule.declarations;
                nr.order = i;
                idIndex.insert(sel.ids.at(0), nr);
            } else if (!sel.elementName.isEmpty()) {
                StyleRule nr;
                nr.selectors += selector;
                nr.declarations = rule.declarations;
                nr.order = i;
                QString name = sel.elementName;
                if (nameCaseSensitivity == Qt::CaseInsensitive)
                    name = std::move(name).toLower();
                nameIndex.insert(name, nr);
            } else {
                universalsSelectors += selector;
            }
        }
        if (!universalsSelectors.isEmpty()) {
            StyleRule nr;
            nr.selectors = universalsSelectors;
            nr.declarations = rule.declarations;
            nr.order = i;
            universals << nr;
        }
    }
    styleRules = universals;
}